

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void AddWindowToDrawData(ImGuiWindow *window,int layer)

{
  int *piVar1;
  ImGuiViewportP *pIVar2;
  ImGuiWindow *window_00;
  ImGuiContext *pIVar3;
  ImGuiViewportP **ppIVar4;
  ImGuiWindow **ppIVar5;
  int i;
  int i_00;
  ImVector<ImGuiWindow_*> *this;
  
  pIVar3 = GImGui;
  ppIVar4 = ImVector<ImGuiViewportP_*>::operator[](&GImGui->Viewports,0);
  pIVar2 = *ppIVar4;
  piVar1 = &(pIVar3->IO).MetricsRenderWindows;
  *piVar1 = *piVar1 + 1;
  AddDrawListToDrawData((pIVar2->DrawDataBuilder).Layers + (uint)layer,window->DrawList);
  this = &(window->DC).ChildWindows;
  for (i_00 = 0; i_00 < this->Size; i_00 = i_00 + 1) {
    ppIVar5 = ImVector<ImGuiWindow_*>::operator[](this,i_00);
    window_00 = *ppIVar5;
    if ((window_00->Active == true) && (window_00->Hidden == false)) {
      AddWindowToDrawData(window_00,layer);
    }
  }
  return;
}

Assistant:

static void AddWindowToDrawData(ImGuiWindow* window, int layer)
{
    ImGuiContext& g = *GImGui;
    ImGuiViewportP* viewport = g.Viewports[0];
    g.IO.MetricsRenderWindows++;
    AddDrawListToDrawData(&viewport->DrawDataBuilder.Layers[layer], window->DrawList);
    for (int i = 0; i < window->DC.ChildWindows.Size; i++)
    {
        ImGuiWindow* child = window->DC.ChildWindows[i];
        if (IsWindowActiveAndVisible(child)) // Clipped children may have been marked not active
            AddWindowToDrawData(child, layer);
    }
}